

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O2

int secp256k1_modinv32_mul_cmp_30
              (secp256k1_modinv32_signed30 *a,int alen,secp256k1_modinv32_signed30 *b,int32_t factor
              )

{
  int32_t *piVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar6;
  undefined8 uStack_70;
  secp256k1_modinv32_signed30 bm;
  secp256k1_modinv32_signed30 am;
  ulong uVar5;
  
  secp256k1_modinv32_mul_30(&am,a,alen,1);
  secp256k1_modinv32_mul_30(&bm,b,9,factor);
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 8) {
      uVar3 = 8;
      while( true ) {
        if ((int)uVar3 < 0) {
          return 0;
        }
        uVar4 = (ulong)uVar3;
        uVar5 = (ulong)uVar3;
        if (am.v[uVar4] < bm.v[uVar5]) break;
        uVar3 = uVar3 - 1;
        if (bm.v[uVar5] < am.v[uVar4]) {
          return 1;
        }
      }
      return -1;
    }
    if (0x3fffffff < (uint)am.v[lVar2]) break;
    piVar1 = bm.v + lVar2;
    lVar2 = lVar2 + 1;
    if (0x3fffffff < (uint)*piVar1) {
      pcVar6 = "test condition failed: bm.v[i] >> 30 == 0";
      uStack_70 = 0x31;
LAB_001390e8:
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modinv32_impl.h"
              ,uStack_70,pcVar6);
      abort();
    }
  }
  pcVar6 = "test condition failed: am.v[i] >> 30 == 0";
  uStack_70 = 0x30;
  goto LAB_001390e8;
}

Assistant:

static int secp256k1_modinv32_mul_cmp_30(const secp256k1_modinv32_signed30 *a, int alen, const secp256k1_modinv32_signed30 *b, int32_t factor) {
    int i;
    secp256k1_modinv32_signed30 am, bm;
    secp256k1_modinv32_mul_30(&am, a, alen, 1); /* Normalize all but the top limb of a. */
    secp256k1_modinv32_mul_30(&bm, b, 9, factor);
    for (i = 0; i < 8; ++i) {
        /* Verify that all but the top limb of a and b are normalized. */
        VERIFY_CHECK(am.v[i] >> 30 == 0);
        VERIFY_CHECK(bm.v[i] >> 30 == 0);
    }
    for (i = 8; i >= 0; --i) {
        if (am.v[i] < bm.v[i]) return -1;
        if (am.v[i] > bm.v[i]) return 1;
    }
    return 0;
}